

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_max_op<float,float,1>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>,3,2>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>
                 (redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
                  *eval,scalar_max_op<float,_float,_1> *func,
                 CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                 *xpr)

{
  uint uVar1;
  type tVar2;
  float fVar3;
  float fVar4;
  float afVar5 [4];
  float local_18 [4];
  
  afVar5 = redux_vec_unroller<Eigen::internal::scalar_max_op<float,float,1>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>,0,2>
           ::run<float__vector(4)>(eval,func);
  local_18._0_8_ = afVar5._0_8_;
  tVar2 = predux_max<1,float__vector(4)>(&local_18);
  fVar4 = (eval->
          super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
          ).
          super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_float>
          .m_d.argImpl.super_evaluator<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>.m_d.data[8]
  ;
  fVar3 = ABS(fVar4);
  uVar1 = -(uint)NAN(fVar4);
  fVar4 = fVar3;
  if (fVar3 <= tVar2) {
    fVar4 = tVar2;
  }
  return (Scalar)((uint)tVar2 & -(uint)NAN(tVar2) |
                 ~-(uint)NAN(tVar2) & (~uVar1 & (uint)fVar4 | uVar1 & (uint)fVar3));
}

Assistant:

EIGEN_DEVICE_FUNC static EIGEN_STRONG_INLINE
  Scalar run(const Evaluator &eval, const Func& func, const XprType &xpr)
  {
    EIGEN_ONLY_USED_FOR_DEBUG(xpr)
    eigen_assert(xpr.rows()>0 && xpr.cols()>0 && "you are using an empty matrix");
    if (VectorizedSize > 0) {
      Scalar res = func.predux(redux_vec_unroller<Func, Evaluator, 0, Size / PacketSize>::template run<PacketType>(eval,func));
      if (VectorizedSize != Size)
        res = func(res,redux_novec_unroller<Func, Evaluator, VectorizedSize, Size-VectorizedSize>::run(eval,func));
      return res;
    }
    else {
      return redux_novec_unroller<Func, Evaluator, 0, Size>::run(eval,func);
    }
  }